

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

UninterpretedOption *
google::protobuf::internal::
down_cast<google::protobuf::UninterpretedOption*,google::protobuf::Message>(Message *f)

{
  long lVar1;
  
  if (f != (Message *)0x0) {
    lVar1 = __dynamic_cast(f,&Message::typeinfo,&UninterpretedOption::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("f == NULL || dynamic_cast<To>(f) != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                    ,0x158,
                    "To google::protobuf::internal::down_cast(From *) [To = google::protobuf::UninterpretedOption *, From = google::protobuf::Message]"
                   );
    }
  }
  return (UninterpretedOption *)f;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && !defined(GOOGLE_PROTOBUF_NO_RTTI)
  assert(f == NULL || dynamic_cast<To>(f) != NULL);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}